

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  local_48.n[0] = a->n[0];
  local_48.n[1] = a->n[1];
  local_48.n[2] = a->n[2];
  local_48.n[3] = a->n[3];
  local_48.n[4] = a->n[4];
  local_48.magnitude = a->magnitude;
  local_48.normalized = a->normalized;
  local_78.n[0] = b->n[0];
  local_78.n[1] = b->n[1];
  local_78.n[2] = b->n[2];
  local_78.n[3] = b->n[3];
  local_78.n[4] = b->n[4];
  local_78.magnitude = b->magnitude;
  local_78.normalized = b->normalized;
  secp256k1_fe_verify(&local_48);
  uVar3 = (local_48.n[4] >> 0x30) * 0x1000003d1 + local_48.n[0];
  uVar2 = (uVar3 >> 0x34) + local_48.n[1];
  uVar4 = (uVar2 >> 0x34) + local_48.n[2];
  uVar5 = (uVar4 >> 0x34) + local_48.n[3];
  local_48.n[3] = uVar5 & 0xfffffffffffff;
  local_48.n[4] = (uVar5 >> 0x34) + (local_48.n[4] & 0xffffffffffff);
  local_48.n[2] = uVar4 & 0xfffffffffffff;
  local_48.n[1] = uVar2 & 0xfffffffffffff;
  local_48.n[0] = uVar3 & 0xfffffffffffff;
  local_48.magnitude = 1;
  secp256k1_fe_verify(&local_48);
  iVar1 = secp256k1_fe_equal(&local_48,&local_78);
  return iVar1;
}

Assistant:

static int fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe an = *a;
    secp256k1_fe bn = *b;
    secp256k1_fe_normalize_weak(&an);
    return secp256k1_fe_equal(&an, &bn);
}